

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O2

void __thiscall
QKmsDevice::parseConnectorProperties(QKmsDevice *this,uint32_t connectorId,QKmsOutput *output)

{
  PropCallback callback;
  drmModeObjectPropertiesPtr objProps;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  code *pcVar1;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  objProps = (drmModeObjectPropertiesPtr)
             drmModeObjectGetProperties
                       (this->m_dri_fd,CONCAT44(in_register_00000034,connectorId),0xc0c0c0c0);
  if (objProps == (drmModeObjectPropertiesPtr)0x0) {
    qLcKmsDebug();
    if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      local_30 = qLcKmsDebug::category.name;
      QMessageLogger::debug(local_48,"Failed to query connector %d object properties",connectorId);
    }
  }
  else {
    pcVar1 = std::
             _Function_handler<void_(_drmModeProperty_*,_unsigned_long_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/platformsupport/kmsconvenience/qkmsdevice.cpp:963:35)>
             ::_M_manager;
    callback.super__Function_base._M_functor._8_8_ = 0;
    callback.super__Function_base._M_functor._M_unused._M_object = output;
    callback.super__Function_base._M_manager =
         std::
         _Function_handler<void_(_drmModeProperty_*,_unsigned_long_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/platformsupport/kmsconvenience/qkmsdevice.cpp:963:35)>
         ::_M_manager;
    callback._M_invoker =
         std::
         _Function_handler<void_(_drmModeProperty_*,_unsigned_long_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/platformsupport/kmsconvenience/qkmsdevice.cpp:963:35)>
         ::_M_invoke;
    enumerateProperties(this,objProps,callback);
    if (pcVar1 != (code *)0x0) {
      (*pcVar1)(&stack0xffffffffffffff98,&stack0xffffffffffffff98,3);
    }
    drmModeFreeObjectProperties(objProps);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QKmsDevice::parseConnectorProperties(uint32_t connectorId, QKmsOutput *output)
{
    drmModeObjectPropertiesPtr objProps = drmModeObjectGetProperties(m_dri_fd, connectorId, DRM_MODE_OBJECT_CONNECTOR);
    if (!objProps) {
        qCDebug(qLcKmsDebug, "Failed to query connector %d object properties", connectorId);
        return;
    }

    enumerateProperties(objProps, [output](drmModePropertyPtr prop, quint64 value) {
        Q_UNUSED(value);
        if (!strcasecmp(prop->name, "crtc_id"))
            output->crtcIdPropertyId = prop->prop_id;
    });

    drmModeFreeObjectProperties(objProps);
}